

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diffusion.cpp
# Opt level: O1

void __thiscall
Diffusion::getViscTerms
          (Diffusion *this,MultiFab *visc_terms,int src_comp,int comp,Real time,int rho_flag,
          MultiFab **beta,int betaComp)

{
  NavierStokesBase *pNVar1;
  int iVar2;
  EBFArrayBoxFactory *pEVar3;
  MultiFab *pMVar4;
  long lVar5;
  MultiFab *weights;
  initializer_list<amrex::Geometry> __l;
  initializer_list<amrex::BoxArray> __l_00;
  initializer_list<amrex::DistributionMapping> __l_01;
  initializer_list<const_amrex::EBFArrayBoxFactory_*> __l_02;
  initializer_list<amrex::MultiFab_*> __l_03;
  initializer_list<amrex::MultiFab_*> __l_04;
  array<amrex::LinOpBCType,_3UL> mlmg_lobc;
  array<amrex::LinOpBCType,_3UL> mlmg_hibc;
  int allthere;
  MLMG mgn;
  MultiFab visc_tmp;
  MLEBABecLap mlabec;
  MultiFab s_tmp;
  allocator_type local_9cc;
  allocator_type local_9cb;
  allocator_type local_9ca;
  allocator_type local_9c9;
  Real local_9c8;
  vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> local_9c0;
  int local_9a8;
  int local_9a4;
  DistributionMapping local_9a0;
  vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
  local_990;
  MultiFab *local_978;
  vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> local_970;
  int local_954;
  LPInfo local_950;
  vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> local_930;
  undefined1 local_918 [112];
  EBFArrayBoxFactory *local_8a8;
  MLMG local_8a0;
  FabArray<amrex::FArrayBox> local_708;
  undefined1 local_588 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_578;
  int local_55c;
  MultiFab local_1b0;
  
  local_9c8 = time;
  checkBeta(this,beta,&local_954);
  if (is_diffusive.super_vector<int,_std::allocator<int>_>.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[comp]
      == 0) {
    local_588._4_4_ =
         (visc_terms->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0];
    local_588._0_4_ = local_588._4_4_;
    local_588._8_4_ = local_588._4_4_;
    amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              (&visc_terms->super_FabArray<amrex::FArrayBox>,0.0,comp - src_comp,1,
               (IntVect *)local_588);
  }
  else {
    local_588._0_8_ = (_func_int **)0x1;
    local_588._8_8_ = (Arena *)0x0;
    local_578.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_578.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_578.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_9a8 = src_comp;
    local_9a4 = rho_flag;
    amrex::MultiFab::MultiFab
              ((MultiFab *)&local_708,this->grids,this->dmap,1,2,(MFInfo *)local_588,
               (this->navier_stokes->super_AmrLevel).m_factory._M_t.
               super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_578);
    local_588._0_8_ = (_func_int **)0x1;
    local_588._8_8_ = (Arena *)0x0;
    local_578.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_578.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_578.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    amrex::MultiFab::MultiFab
              (&local_1b0,this->grids,this->dmap,1,1,(MFInfo *)local_588,
               (this->navier_stokes->super_AmrLevel).m_factory._M_t.
               super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_578);
    amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              (&local_708,0.0,0,local_708.super_FabArrayBase.n_comp,
               &local_708.super_FabArrayBase.n_grow);
    local_950.do_semicoarsening = false;
    local_950.agg_grid_size = -1;
    local_950.con_grid_size = -1;
    local_950.do_agglomeration = (anonymous_namespace)::agglomeration != 0;
    local_950.has_metric_term = true;
    local_950.do_consolidation = (anonymous_namespace)::consolidation != 0;
    local_950.max_coarsening_level = 0;
    local_950.max_semicoarsening_level = 0;
    local_950.semicoarsening_direction = -1;
    local_950.hidden_direction = -1;
    pNVar1 = this->navier_stokes;
    local_978 = visc_terms;
    pEVar3 = (EBFArrayBoxFactory *)
             __dynamic_cast((pNVar1->super_AmrLevel).m_factory._M_t.
                            super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                            .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                            _M_head_impl,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                            &amrex::EBFArrayBoxFactory::typeinfo,0);
    if (pEVar3 == (EBFArrayBoxFactory *)0x0) {
      __cxa_bad_cast();
    }
    memcpy(&local_8a0,&(pNVar1->super_AmrLevel).geom,200);
    __l._M_len = 1;
    __l._M_array = (iterator)&local_8a0;
    std::vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::vector
              (&local_9c0,__l,&local_9c9);
    amrex::BoxArray::BoxArray((BoxArray *)local_918,this->grids);
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)local_918;
    std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::vector
              (&local_970,__l_00,&local_9ca);
    local_9a0.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (this->dmap->m_ref).
             super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_9a0.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (this->dmap->m_ref).
         super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_refcount
         ._M_pi;
    if (local_9a0.m_ref.
        super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_9a0.m_ref.
         super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi)->_M_use_count =
             (local_9a0.m_ref.
              super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_9a0.m_ref.
         super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi)->_M_use_count =
             (local_9a0.m_ref.
              super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    __l_01._M_len = 1;
    __l_01._M_array = &local_9a0;
    std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::vector
              (&local_930,__l_01,&local_9cb);
    __l_02._M_len = 1;
    __l_02._M_array = &local_8a8;
    local_8a8 = pEVar3;
    std::
    vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>::
    vector(&local_990,__l_02,&local_9cc);
    amrex::MLEBABecLap::MLEBABecLap
              ((MLEBABecLap *)local_588,
               (Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)&local_9c0,
               (Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)&local_970,
               (Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
               &local_930,&local_950,
               (Vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
                *)&local_990,1);
    if (local_990.
        super__Vector_base<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_990.
                      super__Vector_base<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_990.
                            super__Vector_base<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_990.
                            super__Vector_base<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::~vector
              (&local_930);
    if (local_9a0.m_ref.
        super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_9a0.m_ref.
                 super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::~vector(&local_970);
    amrex::BoxArray::~BoxArray((BoxArray *)local_918);
    if (local_9c0.super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_9c0.
                      super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_9c0.
                            super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_9c0.
                            super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    local_55c = max_order;
    setDomainBC(this,(array<amrex::LinOpBCType,_3UL> *)&local_9c0,
                (array<amrex::LinOpBCType,_3UL> *)&local_970,comp);
    amrex::MLLinOp::setDomainBC
              ((MLLinOp *)local_588,(Array<BCType,_3> *)&local_9c0,(Array<BCType,_3> *)&local_970);
    amrex::MultiFab::MultiFab((MultiFab *)&local_8a0);
    iVar2 = local_9a4;
    if (0 < this->level) {
      pNVar1 = this->coarser->navier_stokes;
      local_918._0_8_ = (pointer)0x1;
      local_918._8_8_ = 0;
      local_918._16_8_ = 0;
      local_918._24_8_ = 0;
      local_918._32_8_ = 0;
      amrex::MultiFab::define
                ((MultiFab *)&local_8a0,&(pNVar1->super_AmrLevel).grids,
                 &(pNVar1->super_AmrLevel).dmap,1,1,(MFInfo *)local_918,
                 (pNVar1->super_AmrLevel).m_factory._M_t.
                 super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                 .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_918 + 0x10));
      amrex::AmrLevel::FillPatch
                (&pNVar1->super_AmrLevel,(MultiFab *)&local_8a0,1,local_9c8,0,comp,1,0);
      if (iVar2 == 2) {
        pMVar4 = NavierStokesBase::get_rho(pNVar1,local_9c8);
        amrex::MultiFab::Divide((MultiFab *)&local_8a0,pMVar4,0,0,1,1);
      }
      amrex::MLLinOp::setCoarseFineBC
                ((MLLinOp *)local_588,(MultiFab *)&local_8a0,(this->crse_ratio).vect[0]);
    }
    amrex::AmrLevel::FillPatch
              (&this->navier_stokes->super_AmrLevel,&local_1b0,1,local_9c8,0,comp,1,0);
    if (iVar2 == 2) {
      pMVar4 = NavierStokesBase::get_rho(this->navier_stokes,local_9c8);
      amrex::MultiFab::Divide(&local_1b0,pMVar4,0,0,1,1);
    }
    amrex::MLCellLinOp::setLevelBC
              ((MLCellLinOp *)local_588,0,&local_1b0,(MultiFab *)0x0,(MultiFab *)0x0,(MultiFab *)0x0
              );
    amrex::MultiFab::~MultiFab((MultiFab *)&local_8a0);
    amrex::MLEBABecLap::setScalars((MLEBABecLap *)local_588,0.0,-1.0);
    setBeta((MLEBABecLap *)local_588,beta,betaComp,1);
    amrex::MLMG::MLMG(&local_8a0,(MLLinOp *)local_588);
    local_8a0.verbose = verbose;
    local_970.super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&local_708;
    __l_03._M_len = 1;
    __l_03._M_array = (iterator)&local_970;
    std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
              ((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)local_918,__l_03,
               (allocator_type *)&local_990);
    __l_04._M_len = 1;
    __l_04._M_array = (iterator)&local_930;
    local_930.
    super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)&local_1b0;
    std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
              ((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&local_9c0,__l_04,
               (allocator_type *)&local_9a0);
    amrex::MLMG::apply(&local_8a0,
                       (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)local_918,
                       (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&local_9c0);
    pMVar4 = local_978;
    if (local_9c0.super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_9c0.
                      super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_9c0.
                            super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_9c0.
                            super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if ((pointer)local_918._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_918._0_8_,local_918._16_8_ - local_918._0_8_);
    }
    lVar5 = __dynamic_cast((this->navier_stokes->super_AmrLevel).m_factory._M_t.
                           super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                           .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                           _M_head_impl,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                           &amrex::EBFArrayBoxFactory::typeinfo,0);
    if (lVar5 == 0) {
      __cxa_bad_cast();
    }
    weights = amrex::EBDataCollection::getVolFrac(*(EBDataCollection **)(lVar5 + 0xd8));
    amrex::single_level_weighted_redistribute
              ((MultiFab *)&local_708,pMVar4,weights,comp - local_9a8,1,
               &(this->navier_stokes->super_AmrLevel).geom);
    amrex::MLMG::~MLMG(&local_8a0);
    amrex::MLEBABecLap::~MLEBABecLap((MLEBABecLap *)local_588);
    amrex::MultiFab::~MultiFab(&local_1b0);
    amrex::MultiFab::~MultiFab((MultiFab *)&local_708);
  }
  return;
}

Assistant:

void
Diffusion::getViscTerms (MultiFab&              visc_terms,
                         int                    src_comp,
                         int                    comp,
                         Real                   time,
                         int                    rho_flag,
                         const MultiFab* const* beta,
                         int                    betaComp)
{
    int allthere;
    checkBeta(beta, allthere);
    //
    // Before computing the godunov predictors we may have to
    // precompute the viscous source terms.  To do this we must
    // construct a Laplacian operator, set the coeficients and apply
    // it to the time N data.  First, however, we must precompute the
    // fine N bndry values.  We will do this for each scalar that diffuses.
    //
    // Note: This routine DOES NOT fill grow cells
    //

    //
    // FIXME
    // LinOp classes cannot handle multcomponent MultiFabs yet,
    // construct the components one at a time and copy to visc_terms.
    //

    if (is_diffusive[comp])
    {
        int ng = 1;
        int ng_visc(2);// needed for redistribution
        MultiFab visc_tmp(grids,dmap,1,ng_visc,MFInfo(),navier_stokes->Factory()),
                 s_tmp(grids,dmap,1,ng,MFInfo(),navier_stokes->Factory());
	// not sure this is needed...
        visc_tmp.setVal(0.);
        //
        // Set up operator and apply to compute viscous terms.
        //
        const Real a = 0.0;
        const Real b = -1.0;

	LPInfo info;
	info.setAgglomeration(agglomeration);
	info.setConsolidation(consolidation);
	info.setMaxCoarseningLevel(0);

#ifdef AMREX_USE_EB
	const auto& ebf = &(dynamic_cast<EBFArrayBoxFactory const&>(navier_stokes->Factory()));
	MLEBABecLap mlabec({navier_stokes->Geom()}, {grids}, {dmap}, info, {ebf});
#else
	MLABecLaplacian mlabec({navier_stokes->Geom()},{grids},{dmap},info);
#endif

	mlabec.setMaxOrder(max_order);

	{
	  // set BCs

	  std::array<LinOpBCType,AMREX_SPACEDIM> mlmg_lobc;
	  std::array<LinOpBCType,AMREX_SPACEDIM> mlmg_hibc;
	  setDomainBC(mlmg_lobc, mlmg_hibc, comp);

	  mlabec.setDomainBC(mlmg_lobc, mlmg_hibc);

	  MultiFab crsedata;

	  if (level > 0) {
	    auto& crse_ns = *(coarser->navier_stokes);
	    crsedata.define(crse_ns.boxArray(), crse_ns.DistributionMap(), 1, ng,MFInfo(),crse_ns.Factory());
	    AmrLevel::FillPatch(crse_ns,crsedata,ng,time,State_Type,comp,1);
	    if (rho_flag == 2) {
	      // We want to evaluate (div beta grad) S, not rho*S.
	      const MultiFab& rhotime = crse_ns.get_rho(time);
	      MultiFab::Divide(crsedata,rhotime,0,0,1,ng);
	    }
	    mlabec.setCoarseFineBC(&crsedata, crse_ratio[0]);
	  }

	  AmrLevel::FillPatch(*navier_stokes,s_tmp,ng,time,State_Type,comp,1);
	  if (rho_flag == 2) {
	    const MultiFab& rhotime = navier_stokes->get_rho(time);
	    MultiFab::Divide(s_tmp,rhotime,0,0,1,ng);
	  }
	  mlabec.setLevelBC(0, &s_tmp);
	}

	mlabec.setScalars(a,b);
	// mlabec.setACoeffs() not needed since a = 0.0


	setBeta(mlabec, beta, betaComp);

	// Do we need something like this cribbed from mfix???
	// This sets the coefficient on the wall and defines it as a homogeneous
	// Dirichlet bc for the solve. mu_g is the viscosity at cc in mfix
	// matches what's in bcoeff
	//mlabec.setEBHomogDirichlet ( 0, (*mu_g[lev]) );

	MLMG mgn(mlabec);
	mgn.setVerbose(verbose);
	mgn.apply({&visc_tmp},{&s_tmp});

#ifdef AMREX_USE_EB
        const amrex::MultiFab* weights;
        const auto& ebfactory = dynamic_cast<EBFArrayBoxFactory const&>(navier_stokes->Factory());
        weights = &(ebfactory.getVolFrac());

        amrex::single_level_weighted_redistribute(visc_tmp, visc_terms, *weights, comp-src_comp, 1,
                                         navier_stokes->Geom());
#else
	MultiFab::Copy(visc_terms,visc_tmp,0,comp-src_comp,1,0);
#endif

    }
    else
    {
      int ngrow = visc_terms.nGrow();
      visc_terms.setVal(0.0,comp-src_comp,1,ngrow);
    }
}